

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O0

void __thiscall
xLearn::RecallMetricTest_recall_test_Test::TestBody(RecallMetricTest_recall_test_Test *this)

{
  bool bVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  reference pvVar5;
  real_t rVar6;
  vector<float,_std::allocator<float>_> *in_stack_00000070;
  vector<float,_std::allocator<float>_> *in_stack_00000078;
  RecallMetric *in_stack_00000080;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  real_t metric_val;
  ThreadPool *pool;
  size_t threadNumber;
  RecallMetric metric;
  vector<float,_std::allocator<float>_> pred;
  vector<float,_std::allocator<float>_> Y;
  float in_stack_00000228;
  float in_stack_0000022c;
  char *in_stack_00000230;
  char *in_stack_00000238;
  value_type_conflict *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 uVar7;
  RecallMetric *this_00;
  size_t in_stack_fffffffffffffea8;
  vector<float,_std::allocator<float>_> *pvVar8;
  ThreadPool *in_stack_fffffffffffffeb0;
  AssertHelper local_120;
  Message local_118;
  string local_110 [40];
  ThreadPool *in_stack_ffffffffffffff18;
  AssertHelper in_stack_ffffffffffffff20;
  Message local_d8;
  AssertionResult local_d0;
  AssertHelper local_c0;
  Message local_b8;
  AssertionResult local_b0;
  real_t local_9c;
  void *local_98;
  ulong local_90;
  RecallMetric local_88;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  vector<float,_std::allocator<float>_> local_58;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_24;
  vector<float,_std::allocator<float>_> local_20;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x17d281);
  local_24 = 0x3f800000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
            );
  local_38 = 0x3f800000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
            );
  local_3c = 0xbf800000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
            );
  local_40 = 0xbf800000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
            );
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x17d318);
  local_5c = 0x42c80000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
            );
  local_60 = 0x42000000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
            );
  local_64 = 0x41400000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
            );
  local_68 = 0xc1a80000;
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
            );
  RecallMetric::RecallMetric
            ((RecallMetric *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  uVar2 = std::thread::hardware_concurrency();
  local_90 = (ulong)uVar2;
  pvVar3 = operator_new(0x120);
  ThreadPool::ThreadPool(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_98 = pvVar3;
  Metric::Initialize((Metric *)in_stack_ffffffffffffff20.data_,in_stack_ffffffffffffff18);
  RecallMetric::Accumulate(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  local_9c = RecallMetric::GetMetric(&local_88);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_00000238,in_stack_00000230,in_stack_0000022c,in_stack_00000228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x17d53d);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0x72,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message((Message *)0x17d59a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17d5f2);
  RecallMetric::Reset(&local_88);
  pcVar4 = (char *)0x0;
  pvVar8 = &local_20;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,0);
  *pvVar5 = 1.0;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,1);
  *pvVar5 = -1.0;
  this_00 = (RecallMetric *)0x2;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,2);
  *pvVar5 = 1.0;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,3);
  *pvVar5 = -1.0;
  pvVar8 = &local_58;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(size_type)pcVar4);
  *pvVar5 = 12.0;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,1);
  *pvVar5 = 12.0;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,(size_type)this_00);
  *pvVar5 = -12.0;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,3);
  *pvVar5 = -12.0;
  RecallMetric::Accumulate(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  rVar6 = RecallMetric::GetMetric(&local_88);
  local_9c = rVar6;
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_00000238,in_stack_00000230,in_stack_0000022c,in_stack_00000228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
  uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe80);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    in_stack_fffffffffffffe78 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x17d7a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0x7e,(char *)in_stack_fffffffffffffe78);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff20,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff20);
    testing::Message::~Message((Message *)0x17d7fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17d852);
  RecallMetric::metric_type_abi_cxx11_(this_00);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[7]>
            (pcVar4,(char *)CONCAT44(rVar6,uVar7),in_stack_fffffffffffffe78,
             (char (*) [7])CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::__cxx11::string::~string(local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_110 + 0x20));
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x17d931);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0x7f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message((Message *)0x17d983);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17d9d5);
  RecallMetric::~RecallMetric((RecallMetric *)0x17d9e2);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)CONCAT44(rVar6,uVar7));
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)CONCAT44(rVar6,uVar7));
  return;
}

Assistant:

TEST(RecallMetricTest, recall_test) {
  std::vector<real_t> Y;
  Y.push_back(1.0);
  Y.push_back(1.0);
  Y.push_back(-1.0);
  Y.push_back(-1.0);
  std::vector<real_t> pred;
  pred.push_back(100);
  pred.push_back(32);
  pred.push_back(12);
  pred.push_back(-21);
  RecallMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (2.0 / 2.0));
  metric.Reset();
  Y[0] = 1.0;
  Y[1] = -1.0;
  Y[2] = 1.0;
  Y[3] = -1.0;
  pred[0] = 12;
  pred[1] = 12;
  pred[2] = -12;
  pred[3] = -12;
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (1.0 / 2.0));
  EXPECT_EQ(metric.metric_type(), "Recall");
}